

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_FlagsValidator_CommandLineFlagInfo::Run(void)

{
  bool bVar1;
  char *pcVar2;
  FlagSaver fs;
  CommandLineFlagInfo info;
  CommandLineFlagInfo local_e8;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","FlagsValidator","CommandLineFlagInfo");
  info.name._M_dataplus._M_p = (pointer)&info.name.field_2;
  info.name._M_string_length = 0;
  info.name.field_2._M_local_buf[0] = '\0';
  info.type._M_dataplus._M_p = (pointer)&info.type.field_2;
  info.type._M_string_length = 0;
  info.type.field_2._M_local_buf[0] = '\0';
  info.description._M_dataplus._M_p = (pointer)&info.description.field_2;
  info.description._M_string_length = 0;
  info.description.field_2._M_local_buf[0] = '\0';
  info.current_value._M_dataplus._M_p = (pointer)&info.current_value.field_2;
  info.current_value._M_string_length = 0;
  info.current_value.field_2._M_local_buf[0] = '\0';
  info.default_value._M_dataplus._M_p = (pointer)&info.default_value.field_2;
  info.default_value._M_string_length = 0;
  info.default_value.field_2._M_local_buf[0] = '\0';
  info.filename._M_dataplus._M_p = (pointer)&info.filename.field_2;
  info.filename._M_string_length = 0;
  info.filename.field_2._M_local_buf[0] = '\0';
  GetCommandLineFlagInfoOrDie(&local_e8,"test_flag");
  CommandLineFlagInfo::operator=(&info,&local_e8);
  CommandLineFlagInfo::~CommandLineFlagInfo(&local_e8);
  if (info.has_validator_fn != true) {
    bVar1 = RegisterFlagValidator(&(anonymous_namespace)::fLI::FLAGS_test_flag,ValidateTestFlagIs5);
    if (!bVar1) {
      pcVar2 = "RegisterFlagValidator(&FLAGS_test_flag, &ValidateTestFlagIs5)";
      goto LAB_0013a8f0;
    }
    GetCommandLineFlagInfoOrDie(&local_e8,"test_flag");
    CommandLineFlagInfo::operator=(&info,&local_e8);
    CommandLineFlagInfo::~CommandLineFlagInfo(&local_e8);
    if (info.has_validator_fn == false) {
      pcVar2 = "info.has_validator_fn";
      goto LAB_0013a8f0;
    }
    bVar1 = RegisterFlagValidator
                      (&(anonymous_namespace)::fLI::FLAGS_test_flag,(_func_bool_char_ptr_int32 *)0x0
                      );
    if (!bVar1) {
      pcVar2 = "RegisterFlagValidator(&FLAGS_test_flag, NULL)";
      goto LAB_0013a8f0;
    }
    GetCommandLineFlagInfoOrDie(&local_e8,"test_flag");
    CommandLineFlagInfo::operator=(&info,&local_e8);
    CommandLineFlagInfo::~CommandLineFlagInfo(&local_e8);
    if (info.has_validator_fn != true) {
      CommandLineFlagInfo::~CommandLineFlagInfo(&info);
      FlagSaver::~FlagSaver(&fs);
      return;
    }
  }
  pcVar2 = "!(info.has_validator_fn)";
LAB_0013a8f0:
  fprintf(_stderr,"Check failed: %s\n",pcVar2);
  exit(1);
}

Assistant:

TEST(FlagsValidator, CommandLineFlagInfo) {
  CommandLineFlagInfo info;
  info = GetCommandLineFlagInfoOrDie("test_flag");
  EXPECT_FALSE(info.has_validator_fn);

  EXPECT_TRUE(RegisterFlagValidator(&FLAGS_test_flag, &ValidateTestFlagIs5));
  info = GetCommandLineFlagInfoOrDie("test_flag");
  EXPECT_TRUE(info.has_validator_fn);

  EXPECT_TRUE(RegisterFlagValidator(&FLAGS_test_flag, NULL));
  info = GetCommandLineFlagInfoOrDie("test_flag");
  EXPECT_FALSE(info.has_validator_fn);
}